

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

void __thiscall glslang::HlslParseContext::paramFix(HlslParseContext *this,TType *type)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  TQualifier *pTVar7;
  TQualifier *pTVar8;
  HlslParseContext *this_00;
  undefined8 *puVar9;
  byte bVar10;
  TQualifier local_70;
  
  bVar10 = 0;
  iVar2 = (*type->_vptr_TType[10])(type);
  uVar3 = *(uint *)(CONCAT44(extraout_var,iVar2) + 8) & 0x7f;
  if (uVar3 < 2) {
    iVar2 = (*type->_vptr_TType[10])(type);
    lVar5 = CONCAT44(extraout_var_01,iVar2);
    uVar4 = *(ulong *)(lVar5 + 8) & 0xffffffffffffff80 | 0x10;
  }
  else {
    if (uVar3 == 6) {
      iVar2 = (*type->_vptr_TType[10])(type);
      lVar5 = CONCAT44(extraout_var_02,iVar2);
      uVar4 = *(ulong *)(lVar5 + 8);
      uVar6 = 0;
      if ((uVar4 & 0x1ff0000) == 0) {
        uVar6 = (ulong)(((uint)uVar4 & 0xff80) << 9);
      }
      *(ulong *)(lVar5 + 8) = uVar4 & 0xffffc01f1fff007f | uVar6;
      *(ulong *)(lVar5 + 0x1c) = *(ulong *)(lVar5 + 0x1c) & 0xffffffff8000 | 0xffff000000004fff;
      *(uint *)(lVar5 + 0x24) = *(uint *)(lVar5 + 0x24) | 0x7fffffff;
      pTVar7 = &this->globalBufferDefaults;
      pTVar8 = &local_70;
      for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
        pTVar8->semanticName = pTVar7->semanticName;
        pTVar7 = (TQualifier *)((long)pTVar7 + (ulong)bVar10 * -0x10 + 8);
        pTVar8 = (TQualifier *)((long)pTVar8 + (ulong)bVar10 * -0x10 + 8);
      }
      this_00 = (HlslParseContext *)type;
      iVar2 = (*type->_vptr_TType[10])();
      mergeObjectLayoutQualifiers
                (this_00,&local_70,(TQualifier *)CONCAT44(extraout_var_03,iVar2),true);
      iVar2 = (*type->_vptr_TType[10])(type);
      uVar1 = *(undefined8 *)(CONCAT44(extraout_var_04,iVar2) + 8);
      iVar2 = (*type->_vptr_TType[10])(type);
      uVar4 = *(ulong *)(CONCAT44(extraout_var_05,iVar2) + 8);
      iVar2 = (*type->_vptr_TType[10])(type);
      uVar6 = *(ulong *)(CONCAT44(extraout_var_06,iVar2) + 8);
      iVar2 = (*type->_vptr_TType[10])(type);
      local_70._8_8_ =
           *(ulong *)(CONCAT44(extraout_var_07,iVar2) + 8) & 0x1ff0000 |
           uVar6 & 0x2000000000000 |
           uVar4 & 0x800000000000 |
           local_70._8_8_ & 0xfffd7ffffe00ff80 | (ulong)((uint)uVar1 & 0x7f);
      iVar2 = (*type->_vptr_TType[10])(type);
      pTVar7 = &local_70;
      puVar9 = (undefined8 *)CONCAT44(extraout_var_08,iVar2);
      for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar9 = pTVar7->semanticName;
        pTVar7 = (TQualifier *)((long)pTVar7 + (ulong)bVar10 * -0x10 + 8);
        puVar9 = puVar9 + (ulong)bVar10 * -2 + 1;
      }
      return;
    }
    if (uVar3 != 2) {
      return;
    }
    iVar2 = (*type->_vptr_TType[10])(type);
    lVar5 = CONCAT44(extraout_var_00,iVar2);
    uVar4 = *(ulong *)(lVar5 + 8) & 0xffffffffffffff80 | 0x13;
  }
  *(ulong *)(lVar5 + 8) = uVar4;
  return;
}

Assistant:

void HlslParseContext::paramFix(TType& type)
{
    switch (type.getQualifier().storage) {
    case EvqConst:
        type.getQualifier().storage = EvqConstReadOnly;
        break;
    case EvqGlobal:
    case EvqTemporary:
        type.getQualifier().storage = EvqIn;
        break;
    case EvqBuffer:
        {
            // SSBO parameter.  These do not go through the declareBlock path since they are fn parameters.
            correctUniform(type.getQualifier());
            TQualifier bufferQualifier = globalBufferDefaults;
            mergeObjectLayoutQualifiers(bufferQualifier, type.getQualifier(), true);
            bufferQualifier.storage = type.getQualifier().storage;
            bufferQualifier.readonly = type.getQualifier().readonly;
            bufferQualifier.coherent = type.getQualifier().coherent;
            bufferQualifier.declaredBuiltIn = type.getQualifier().declaredBuiltIn;
            type.getQualifier() = bufferQualifier;
            break;
        }
    default:
        break;
    }
}